

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
::CreateTest(TestFactoryImpl<optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
             *this)

{
  Test *this_00;
  TestFactoryImpl<optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
  *this_local;
  
  this_00 = (Test *)operator_new(0x28);
  optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
  ::optTyped_swapNotEmptyWithNotEmpty_Test
            ((optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
              *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }